

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Menu.cpp
# Opt level: O3

void __thiscall Menu::Menu(Menu *this,string *fileName)

{
  istream *piVar1;
  string input;
  ifstream inputFile;
  undefined1 *local_258 [2];
  undefined1 local_248 [16];
  long local_238 [4];
  byte abStack_218 [488];
  
  (this->options)._M_dataplus._M_p = (pointer)&(this->options).field_2;
  (this->options)._M_string_length = 0;
  (this->options).field_2._M_local_buf[0] = '\0';
  std::ifstream::ifstream(local_238);
  std::ifstream::open((string *)local_238,(_Ios_Openmode)fileName);
  local_258[0] = local_248;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_258);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0) {
    while( true ) {
      piVar1 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_238,(string *)local_258,'\n');
      if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
      std::__cxx11::string::_M_append((char *)this,(ulong)local_258[0]);
      std::__cxx11::string::append((char *)this);
    }
    std::ifstream::close();
  }
  else {
    std::__cxx11::string::_M_replace
              ((ulong)this,0,(char *)(this->options)._M_string_length,0x1282b2);
  }
  if (local_258[0] != local_248) {
    operator_delete(local_258[0]);
  }
  std::ifstream::~ifstream(local_238);
  return;
}

Assistant:

Menu::Menu(std::string fileName) {
    // Open the file for reading
    std::ifstream inputFile;

    inputFile.open(fileName);

    std::string input = "";

    // Read each line of the file into the menu option string

    if(inputFile){
        while( std::getline(inputFile, input, '\n') ){
            options.append(input);
            options.append("\n");
        }
        inputFile.close();
    }
    else {
        options = "Nothing was loaded.";
    }
}